

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pystring.cpp
# Opt level: O3

int pystring::anon_unknown_1::_string_tailmatch
              (string *self,string *substr,Py_ssize_t start,Py_ssize_t end,int direction)

{
  uint uVar1;
  int iVar2;
  undefined4 in_register_00000014;
  int iVar3;
  int in_R9D;
  uint uVar4;
  uint uVar5;
  int in_stack_00000008;
  
  iVar3 = (int)substr;
  iVar2 = iVar3;
  if ((in_R9D <= iVar3) && (iVar2 = in_R9D, in_R9D < 0)) {
    iVar2 = 0;
    if (0 < in_R9D + iVar3) {
      iVar2 = in_R9D + iVar3;
    }
  }
  uVar1 = 0;
  uVar4 = iVar3 + direction;
  if (iVar3 + direction < 1) {
    uVar4 = 0;
  }
  if (-1 < direction) {
    uVar4 = direction;
  }
  if (in_stack_00000008 < 0) {
    uVar5 = uVar4;
    if (iVar3 < (int)(uVar4 + end)) {
      return 0;
    }
  }
  else {
    if (iVar3 < (int)uVar4 || (int)(iVar2 - uVar4) < end) {
      return 0;
    }
    uVar5 = iVar2 - end;
    if (iVar2 - end <= (int)uVar4) {
      uVar5 = uVar4;
    }
  }
  if (end <= (int)(iVar2 - uVar5)) {
    iVar2 = bcmp((void *)((long)&(self->_M_dataplus)._M_p + (ulong)uVar5),
                 (void *)CONCAT44(in_register_00000014,start),(long)end);
    uVar1 = (uint)(iVar2 == 0);
  }
  return uVar1;
}

Assistant:

int _string_tailmatch(const std::string & self, const std::string & substr,
                              Py_ssize_t start, Py_ssize_t end,
                              int direction)
        {
            Py_ssize_t len = (Py_ssize_t) self.size();
            Py_ssize_t slen = (Py_ssize_t) substr.size();
            
            const char* sub = substr.c_str();
            const char* str = self.c_str();
            
            ADJUST_INDICES(start, end, len);
            
            if (direction < 0) {
                // startswith
                if (start+slen > len)
                    return 0;
            } else {
                // endswith
                if (end-start < slen || start > len)
                    return 0;
                if (end-slen > start)
                    start = end - slen;
            }
            if (end-start >= slen)
                return (!std::memcmp(str+start, sub, slen));
            
            return 0;
        }